

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O3

void __thiscall
wasm::DataFlow::UseFinder::addSetUses
          (UseFinder *this,LocalSet *set,Graph *graph,LocalGraph *localGraph,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *ret)

{
  pointer *pppEVar1;
  LocalGet *get;
  ulong uVar2;
  LocalSet *set_00;
  LocalGet *pLVar3;
  iterator __position;
  int iVar4;
  SetInfluences *pSVar5;
  ostream *poVar6;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  GetInfluences *pGVar7;
  iterator iVar8;
  long lVar9;
  char *pcVar10;
  _Hash_node_base *p_Var11;
  pair<std::__detail::_Node_iterator<wasm::LocalSet_*,_true,_false>,_bool> pVar12;
  LocalSet *local_50;
  LocalSet *set_local;
  LocalGet *local_40;
  Expression *value;
  
  local_50 = set;
  set_local = (LocalSet *)graph;
  pVar12 = std::
           _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           ::_M_emplace<wasm::LocalSet*&>
                     ((_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)this,&local_50);
  if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pSVar5 = LocalGraph::getSetInfluences(localGraph,local_50);
    iVar4 = debug();
    if (1 < iVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"addSetUses for ",0xf);
      poVar6 = std::ostream::_M_insert<void_const*>(&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," gets\n",6);
    }
    p_Var11 = (pSVar5->_M_h)._M_before_begin._M_nxt;
    if (p_Var11 != (_Hash_node_base *)0x0) {
      this_00 = (_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(set_local + 5);
      do {
        get = (LocalGet *)p_Var11[1]._M_nxt;
        pGVar7 = LocalGraph::getGetInfluences(localGraph,get);
        uVar2 = (pGVar7->_M_h)._M_element_count;
        if (1 < uVar2) {
          __assert_fail("sets.size() <= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                        ,0x67,
                        "void wasm::DataFlow::UseFinder::addSetUses(LocalSet *, Graph &, LocalGraph &, std::vector<Expression *> &)"
                       );
        }
        if (uVar2 == 0) {
          local_40 = get;
          iVar8 = std::
                  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(this_00,(key_type *)&local_40);
          if (((iVar8.
                super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>
                ._M_cur == (__node_type *)0x0) ||
              (*(char **)((long)iVar8.
                                super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>
                                ._M_cur + 0x10) == (char *)0x0)) ||
             (**(char **)((long)iVar8.
                                super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Expression_*>,_false>
                                ._M_cur + 0x10) != '\x12')) {
            local_40 = (LocalGet *)0x0;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)ret,
                       (Expression **)&local_40);
            iVar4 = debug();
            if (1 < iVar4) {
              lVar9 = 0xc;
              poVar6 = (ostream *)&std::cout;
              pcVar10 = "add nullptr\n";
              goto LAB_00b3c074;
            }
          }
        }
        else {
          set_00 = (LocalSet *)(pGVar7->_M_h)._M_before_begin._M_nxt[1]._M_nxt;
          pLVar3 = (LocalGet *)set_00->value;
          if (pLVar3 == get) {
            addSetUses(this,set_00,(Graph *)set_local,localGraph,ret);
          }
          else {
            __position._M_current =
                 (ret->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            local_40 = pLVar3;
            if (__position._M_current ==
                (ret->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              _M_realloc_insert<wasm::Expression*const&>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)ret,
                         __position,(Expression **)&local_40);
            }
            else {
              *__position._M_current = (Expression *)pLVar3;
              pppEVar1 = &(ret->
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppEVar1 = *pppEVar1 + 1;
            }
            iVar4 = debug();
            if (1 < iVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"add a value\n",0xc);
              poVar6 = std::ostream::_M_insert<void_const*>(&std::cout);
              value._7_1_ = 10;
              lVar9 = 1;
              pcVar10 = (char *)((long)&value + 7);
LAB_00b3c074:
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,lVar9);
            }
          }
        }
        p_Var11 = p_Var11->_M_nxt;
      } while (p_Var11 != (_Hash_node_base *)0x0);
    }
  }
  return;
}

Assistant:

void addSetUses(LocalSet* set,
                  Graph& graph,
                  LocalGraph& localGraph,
                  std::vector<Expression*>& ret) {
    // If already handled, nothing to do here.
    if (!seenSets.emplace(set).second) {
      return;
    }
    // Find all the uses of that set.
    auto& gets = localGraph.getSetInfluences(set);
    if (debug() >= 2) {
      std::cout << "addSetUses for " << set << ", " << gets.size() << " gets\n";
    }
    for (auto* get : gets) {
      // Each of these relevant gets is either
      //  (1) a child of a set, which we can track, or
      //  (2) not a child of a set, e.g., a call argument or such
      auto& sets = localGraph.getGetInfluences(get); // TODO: iterator
      // In flat IR, each get can influence at most 1 set.
      assert(sets.size() <= 1);
      if (sets.size() == 0) {
        // This get is not the child of a set. Check if it is a drop,
        // otherwise it is an actual use, and so an external use.
        auto* parent = graph.getParent(get);
        if (parent && parent->is<Drop>()) {
          // Just ignore it.
        } else {
          ret.push_back(nullptr);
          if (debug() >= 2) {
            std::cout << "add nullptr\n";
          }
        }
      } else {
        // This get is the child of a set.
        auto* subSet = *sets.begin();
        // If this is a copy, we need to look through it: data-flow IR
        // counts actual values, not copies, and in particular we need
        // to look through the copies that implement a phi.
        if (subSet->value == get) {
          // Indeed a copy.
          // TODO: this could be optimized and done all at once beforehand.
          addSetUses(subSet, graph, localGraph, ret);
        } else {
          // Not a copy.
          auto* value = subSet->value;
          ret.push_back(value);
          if (debug() >= 2) {
            std::cout << "add a value\n" << value << '\n';
          }
        }
      }
    }
  }